

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O3

Cursor * __thiscall Table::leafNodeFind(Table *this,uint32_t pageNum,uint32_t key)

{
  char *node;
  uint32_t *puVar1;
  Cursor *pCVar2;
  uint32_t cell_num;
  uint32_t uVar3;
  uint32_t uVar4;
  
  node = Pager::getPage(this->pager,pageNum);
  puVar1 = leaf_node_num_cells(node);
  uVar4 = *puVar1;
  pCVar2 = (Cursor *)operator_new(0x18);
  pCVar2->table = this;
  pCVar2->pageNum = pageNum;
  if (uVar4 == 0) {
    cell_num = 0;
  }
  else {
    uVar3 = 0;
    do {
      cell_num = uVar3 + uVar4 >> 1;
      puVar1 = leaf_node_key(node,cell_num);
      if (*puVar1 == key) break;
      if (*puVar1 <= key) {
        uVar3 = cell_num + 1;
        cell_num = uVar4;
      }
      uVar4 = cell_num;
      cell_num = uVar4;
    } while (uVar4 != uVar3);
  }
  pCVar2->cellNum = cell_num;
  return pCVar2;
}

Assistant:

Cursor* Table::leafNodeFind(uint32_t pageNum, uint32_t key) {
	char *node = pager->getPage(pageNum);
	uint32_t numOfCells = *leaf_node_num_cells(node);

	Cursor *c = new Cursor;
	c->table = this;
	c->pageNum = pageNum;

	//Binary search
	uint32_t minIndex = 0;
	uint32_t onePastMaxIndex = numOfCells;
	while (onePastMaxIndex != minIndex) {
		uint32_t index = (onePastMaxIndex + minIndex) / 2;
		uint32_t keyAtIndex = *(leaf_node_key(node, index));
		if (key == keyAtIndex) {
			c->cellNum = index;
			return c;
		}
		if (key < keyAtIndex) {
			onePastMaxIndex = index;
		} else {
			minIndex = index + 1;
		}
	}

	c->cellNum = minIndex;
	return c;
}